

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::WordBoundaryTestInst<true>::Exec
          (WordBoundaryTestInst<true> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  bVar3 = false;
  uVar4 = 0;
  bVar2 = false;
  if (*inputOffset != 0) {
    bVar2 = StandardChars<char16_t>::IsWord((matcher->standardChars).ptr,input[*inputOffset - 1]);
    uVar4 = (ulong)*inputOffset;
  }
  if ((uint)uVar4 < inputLength) {
    bVar3 = StandardChars<char16_t>::IsWord((matcher->standardChars).ptr,input[uVar4]);
  }
  if (bVar2 == bVar3) {
    *instPointer = *instPointer + 1;
    bVar2 = false;
  }
  else {
    bVar2 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  return bVar2;
}

Assistant:

inline bool WordBoundaryTestInst<isNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        const bool prev = inputOffset > 0 && matcher.standardChars->IsWord(input[inputOffset - 1]);
        const bool curr = inputOffset < inputLength && matcher.standardChars->IsWord(input[inputOffset]);
        if (isNegation == (prev != curr))
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        instPointer += sizeof(*this);
        return false;
    }